

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O1

int64_t absl::lts_20250127::base_internal::ReadMonotonicClockNanos(void)

{
  int iVar1;
  int *piVar2;
  long *plVar3;
  long *plVar4;
  timespec t;
  long *local_80;
  long local_78;
  long local_70;
  undefined4 uStack_68;
  undefined4 uStack_64;
  timespec local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  iVar1 = clock_gettime(4,&local_60);
  if (iVar1 == 0) {
    return local_60.tv_sec * 1000000000 + local_60.tv_nsec;
  }
  piVar2 = __errno_location();
  std::__cxx11::to_string(&local_30,*piVar2);
  std::operator+(&local_50,"clock_gettime() failed: (",&local_30);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_80 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_80 == plVar4) {
    local_70 = *plVar4;
    uStack_68 = (undefined4)plVar3[3];
    uStack_64 = *(undefined4 *)((long)plVar3 + 0x1c);
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar4;
  }
  local_78 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
            (3,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/base/internal/sysinfo.cc"
             ,0xf8);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/base/internal/sysinfo.cc"
                ,0xf8,"int64_t absl::base_internal::ReadMonotonicClockNanos()");
}

Assistant:

static int64_t ReadMonotonicClockNanos() {
  struct timespec t;
#ifdef CLOCK_MONOTONIC_RAW
  int rc = clock_gettime(CLOCK_MONOTONIC_RAW, &t);
#else
  int rc = clock_gettime(CLOCK_MONOTONIC, &t);
#endif
  if (rc != 0) {
    ABSL_INTERNAL_LOG(
        FATAL, "clock_gettime() failed: (" + std::to_string(errno) + ")");
  }
  return int64_t{t.tv_sec} * 1000000000 + t.tv_nsec;
}